

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_examples.cpp
# Opt level: O3

void example1(char *filename,char *file_Y,char *file_Cb,char *file_Cr,char *file_rgb_recov)

{
  double dVar1;
  double dVar2;
  double dVar3;
  BITMAPINFOHEADER bmInfo;
  BITMAPINFOHEADER bmInfo_00;
  BITMAPINFOHEADER bmInfo_01;
  BITMAPINFOHEADER bmInfo_02;
  BITMAPINFOHEADER bmInfo_03;
  BITMAPINFOHEADER bmInfo_04;
  BITMAPINFOHEADER bmInfo_05;
  BITMAPINFOHEADER bmInfo_06;
  BITMAPINFOHEADER bmInfo_07;
  BITMAPINFOHEADER bmInfo_08;
  BITMAPINFOHEADER bmInfo_09;
  BITMAPINFOHEADER bmInfo_10;
  uint w;
  uint h;
  TRIPLEBYTES **mrx1;
  TRIPLEYCbCr **mrx;
  TRIPLERGB **mrxY;
  TRIPLERGB **mrxCb;
  TRIPLERGB **mrxCr;
  TRIPLEBYTES **mrx2;
  ostream *poVar4;
  int *piVar5;
  int h_00;
  int N;
  ulong uVar6;
  ulong uVar7;
  BITMAPFILEHEADER bmFileDef;
  BITMAPINFOHEADER bmInfoDef;
  BITMAPFILEHEADER local_88;
  double local_78;
  double local_70;
  double local_68;
  ulong local_60;
  BITMAPINFOHEADER local_58;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading file...\n",0x10)
  ;
  system("mkdir -p images");
  system("mkdir -p histograms");
  mrx1 = (TRIPLEBYTES **)loadBMPFile(&local_88,&local_58,filename);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-------------------------------------\n",0x26);
  bmInfo.biPlanes = local_58.biPlanes;
  bmInfo.biBitCount = local_58.biBitCount;
  bmInfo.biHeight = local_58.biHeight;
  bmInfo.biWidth = local_58.biWidth;
  bmInfo.biSize = local_58.biSize;
  bmInfo.biCompression = local_58.biCompression;
  bmInfo.biSizeImage = local_58.biSizeImage;
  bmInfo.biXPelsPerMeter = local_58.biXPelsPerMeter;
  bmInfo.biYPelsPerMeter = local_58.biYPelsPerMeter;
  bmInfo.biClrUsed = local_58.biClrUsed;
  bmInfo.biClrImportant = local_58.biClrImportant;
  printHeader(local_88,bmInfo);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-------------------------------------\n",0x26);
  h = local_58.biHeight;
  w = local_58.biWidth;
  uVar6 = (ulong)local_58.biHeight;
  mrx = RGB2YCbCr((TRIPLERGB **)mrx1,uVar6,(ulong)local_58.biWidth);
  bmInfo_00.biPlanes = local_58.biPlanes;
  bmInfo_00.biBitCount = local_58.biBitCount;
  bmInfo_00.biHeight = local_58.biHeight;
  bmInfo_00.biWidth = local_58.biWidth;
  bmInfo_00.biSize = local_58.biSize;
  bmInfo_00.biCompression = local_58.biCompression;
  bmInfo_00.biSizeImage = local_58.biSizeImage;
  bmInfo_00.biXPelsPerMeter = local_58.biXPelsPerMeter;
  bmInfo_00.biYPelsPerMeter = local_58.biYPelsPerMeter;
  bmInfo_00.biClrUsed = local_58.biClrUsed;
  bmInfo_00.biClrImportant = local_58.biClrImportant;
  save_components_to_files
            ((TRIPLERGB **)mrx1,local_88,bmInfo_00,0,"file_Red.bmp","file_Green.bmp","file_Blue.bmp"
            );
  bmInfo_01.biPlanes = local_58.biPlanes;
  bmInfo_01.biBitCount = local_58.biBitCount;
  bmInfo_01.biHeight = local_58.biHeight;
  bmInfo_01.biWidth = local_58.biWidth;
  bmInfo_01.biSize = local_58.biSize;
  bmInfo_01.biCompression = local_58.biCompression;
  bmInfo_01.biSizeImage = local_58.biSizeImage;
  bmInfo_01.biXPelsPerMeter = local_58.biXPelsPerMeter;
  bmInfo_01.biYPelsPerMeter = local_58.biYPelsPerMeter;
  bmInfo_01.biClrUsed = local_58.biClrUsed;
  bmInfo_01.biClrImportant = local_58.biClrImportant;
  save_components_to_files
            ((TRIPLERGB **)mrx,local_88,bmInfo_01,1,"file_Y.bmp","file_Cb.bmp","file_Cr.bmp");
  mrxY = loadBMPFile(&local_88,&local_58,file_Y);
  mrxCb = loadBMPFile(&local_88,&local_58,file_Cb);
  mrxCr = loadBMPFile(&local_88,&local_58,file_Cr);
  local_60 = uVar6;
  mrx2 = (TRIPLEBYTES **)YCbCr2RGB(mrxY,mrxCb,mrxCr,h,w);
  bmInfo_02.biPlanes = local_58.biPlanes;
  bmInfo_02.biBitCount = local_58.biBitCount;
  bmInfo_02.biHeight = local_58.biHeight;
  bmInfo_02.biWidth = local_58.biWidth;
  bmInfo_02.biSize = local_58.biSize;
  bmInfo_02.biCompression = local_58.biCompression;
  bmInfo_02.biSizeImage = local_58.biSizeImage;
  bmInfo_02.biXPelsPerMeter = local_58.biXPelsPerMeter;
  bmInfo_02.biYPelsPerMeter = local_58.biYPelsPerMeter;
  bmInfo_02.biClrUsed = local_58.biClrUsed;
  bmInfo_02.biClrImportant = local_58.biClrImportant;
  saveBMPFile(local_88,bmInfo_02,(TRIPLERGB **)mrx2,file_rgb_recov);
  dVar1 = getPSNR(mrx1,mrx2,0,0,h,w,0);
  dVar2 = getPSNR(mrx1,mrx2,0,0,h,w,1);
  dVar3 = getPSNR(mrx1,mrx2,0,0,h,w,2);
  checkCorrelationProperties((TRIPLERGB **)mrx1,h,w,0);
  checkCorrelationProperties((TRIPLERGB **)mrx,h,w,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-------------------------------------\n",0x26);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"PSNR(red)[RGB, RGBr] = ",0x17);
  poVar4 = std::ostream::_M_insert<double>(dVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"PSNR(green)[RGB, RGBr] = ",0x19);
  poVar4 = std::ostream::_M_insert<double>(dVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"PSNR(blue)[RGB, RGBr] = ",0x18);
  poVar4 = std::ostream::_M_insert<double>(dVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-------------------------------------\n",0x26);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nDecimation \"mean\" x2:\n",0x17);
  bmInfo_03.biPlanes = local_58.biPlanes;
  bmInfo_03.biBitCount = local_58.biBitCount;
  bmInfo_03.biHeight = local_58.biHeight;
  bmInfo_03.biWidth = local_58.biWidth;
  bmInfo_03.biSize = local_58.biSize;
  bmInfo_03.biCompression = local_58.biCompression;
  bmInfo_03.biSizeImage = local_58.biSizeImage;
  bmInfo_03.biXPelsPerMeter = local_58.biXPelsPerMeter;
  bmInfo_03.biYPelsPerMeter = local_58.biYPelsPerMeter;
  bmInfo_03.biClrUsed = local_58.biClrUsed;
  bmInfo_03.biClrImportant = local_58.biClrImportant;
  decimationAndRecovering
            (mrxCb,local_88,bmInfo_03,1,2,"images/decMeanCb2.bmp","images/recMeanCb2.bmp");
  bmInfo_04.biPlanes = local_58.biPlanes;
  bmInfo_04.biBitCount = local_58.biBitCount;
  bmInfo_04.biHeight = local_58.biHeight;
  bmInfo_04.biWidth = local_58.biWidth;
  bmInfo_04.biSize = local_58.biSize;
  bmInfo_04.biCompression = local_58.biCompression;
  bmInfo_04.biSizeImage = local_58.biSizeImage;
  bmInfo_04.biXPelsPerMeter = local_58.biXPelsPerMeter;
  bmInfo_04.biYPelsPerMeter = local_58.biYPelsPerMeter;
  bmInfo_04.biClrUsed = local_58.biClrUsed;
  bmInfo_04.biClrImportant = local_58.biClrImportant;
  decimationAndRecovering
            (mrxCr,local_88,bmInfo_04,1,2,"images/decMeanCr2.bmp","images/recMeanCr2.bmp");
  check_PSNR_for_recov
            ((TRIPLERGB **)mrx1,mrxY,mrxCb,mrxCr,"images/recMeanCb2.bmp","images/recMeanCr2.bmp",
             "images/recoveryMeanRGB2.bmp");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nDecimation \"mean\" x4:\n",0x17);
  bmInfo_05.biPlanes = local_58.biPlanes;
  bmInfo_05.biBitCount = local_58.biBitCount;
  bmInfo_05.biHeight = local_58.biHeight;
  bmInfo_05.biWidth = local_58.biWidth;
  bmInfo_05.biSize = local_58.biSize;
  bmInfo_05.biCompression = local_58.biCompression;
  bmInfo_05.biSizeImage = local_58.biSizeImage;
  bmInfo_05.biXPelsPerMeter = local_58.biXPelsPerMeter;
  bmInfo_05.biYPelsPerMeter = local_58.biYPelsPerMeter;
  bmInfo_05.biClrUsed = local_58.biClrUsed;
  bmInfo_05.biClrImportant = local_58.biClrImportant;
  decimationAndRecovering
            (mrxCb,local_88,bmInfo_05,1,4,"images/decMeanCb4.bmp","images/recMeanCb4.bmp");
  bmInfo_06.biPlanes = local_58.biPlanes;
  bmInfo_06.biBitCount = local_58.biBitCount;
  bmInfo_06.biHeight = local_58.biHeight;
  bmInfo_06.biWidth = local_58.biWidth;
  bmInfo_06.biSize = local_58.biSize;
  bmInfo_06.biCompression = local_58.biCompression;
  bmInfo_06.biSizeImage = local_58.biSizeImage;
  bmInfo_06.biXPelsPerMeter = local_58.biXPelsPerMeter;
  bmInfo_06.biYPelsPerMeter = local_58.biYPelsPerMeter;
  bmInfo_06.biClrUsed = local_58.biClrUsed;
  bmInfo_06.biClrImportant = local_58.biClrImportant;
  decimationAndRecovering
            (mrxCr,local_88,bmInfo_06,1,4,"images/decMeanCr4.bmp","images/recMeanCr4.bmp");
  check_PSNR_for_recov
            ((TRIPLERGB **)mrx1,mrxY,mrxCb,mrxCr,"images/recMeanCb4.bmp","images/recMeanCr4.bmp",
             "images/recoveryMeanRGB4.bmp");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nDecimation \"ejection\" x2:\n",0x1b);
  bmInfo_07.biPlanes = local_58.biPlanes;
  bmInfo_07.biBitCount = local_58.biBitCount;
  bmInfo_07.biHeight = local_58.biHeight;
  bmInfo_07.biWidth = local_58.biWidth;
  bmInfo_07.biSize = local_58.biSize;
  bmInfo_07.biCompression = local_58.biCompression;
  bmInfo_07.biSizeImage = local_58.biSizeImage;
  bmInfo_07.biXPelsPerMeter = local_58.biXPelsPerMeter;
  bmInfo_07.biYPelsPerMeter = local_58.biYPelsPerMeter;
  bmInfo_07.biClrUsed = local_58.biClrUsed;
  bmInfo_07.biClrImportant = local_58.biClrImportant;
  decimationAndRecovering
            (mrxCb,local_88,bmInfo_07,0,2,"images/decEjectCb2.bmp","images/recEjectCb2.bmp");
  bmInfo_08.biPlanes = local_58.biPlanes;
  bmInfo_08.biBitCount = local_58.biBitCount;
  bmInfo_08.biHeight = local_58.biHeight;
  bmInfo_08.biWidth = local_58.biWidth;
  bmInfo_08.biSize = local_58.biSize;
  bmInfo_08.biCompression = local_58.biCompression;
  bmInfo_08.biSizeImage = local_58.biSizeImage;
  bmInfo_08.biXPelsPerMeter = local_58.biXPelsPerMeter;
  bmInfo_08.biYPelsPerMeter = local_58.biYPelsPerMeter;
  bmInfo_08.biClrUsed = local_58.biClrUsed;
  bmInfo_08.biClrImportant = local_58.biClrImportant;
  decimationAndRecovering
            (mrxCr,local_88,bmInfo_08,0,2,"images/decEjectCr2.bmp","images/recEjectCr2.bmp");
  check_PSNR_for_recov
            ((TRIPLERGB **)mrx1,mrxY,mrxCb,mrxCr,"images/recEjectCb2.bmp","images/recEjectCr2.bmp",
             "images/recoveryEjectRGB2.bmp");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nDecimation \"ejection\" x4:\n",0x1b);
  bmInfo_09.biPlanes = local_58.biPlanes;
  bmInfo_09.biBitCount = local_58.biBitCount;
  bmInfo_09.biHeight = local_58.biHeight;
  bmInfo_09.biWidth = local_58.biWidth;
  bmInfo_09.biSize = local_58.biSize;
  bmInfo_09.biCompression = local_58.biCompression;
  bmInfo_09.biSizeImage = local_58.biSizeImage;
  bmInfo_09.biXPelsPerMeter = local_58.biXPelsPerMeter;
  bmInfo_09.biYPelsPerMeter = local_58.biYPelsPerMeter;
  bmInfo_09.biClrUsed = local_58.biClrUsed;
  bmInfo_09.biClrImportant = local_58.biClrImportant;
  decimationAndRecovering
            (mrxCb,local_88,bmInfo_09,0,4,"images/decEjectCb4.bmp","images/recEjectCb4.bmp");
  bmInfo_10.biPlanes = local_58.biPlanes;
  bmInfo_10.biBitCount = local_58.biBitCount;
  bmInfo_10.biHeight = local_58.biHeight;
  bmInfo_10.biWidth = local_58.biWidth;
  bmInfo_10.biSize = local_58.biSize;
  bmInfo_10.biCompression = local_58.biCompression;
  bmInfo_10.biSizeImage = local_58.biSizeImage;
  bmInfo_10.biXPelsPerMeter = local_58.biXPelsPerMeter;
  bmInfo_10.biYPelsPerMeter = local_58.biYPelsPerMeter;
  bmInfo_10.biClrUsed = local_58.biClrUsed;
  bmInfo_10.biClrImportant = local_58.biClrImportant;
  decimationAndRecovering
            (mrxCr,local_88,bmInfo_10,0,4,"images/decEjectCr4.bmp","images/recEjectCr4.bmp");
  check_PSNR_for_recov
            ((TRIPLERGB **)mrx1,mrxY,mrxCb,mrxCr,"images/recEjectCb4.bmp","images/recEjectCr4.bmp",
             "images/recoveryEjectRGB4.bmp");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-------------------------------------\n",0x26);
  uVar6 = local_60;
  h_00 = (int)local_60;
  piVar5 = getHistFreqFromTriple
                     ((TRIPLERGB **)mrx1,h_00,w,0,"histograms/Part1/histRed/","histRed.csv");
  N = h_00 * w;
  dVar1 = getEntropy(piVar5,N);
  if (piVar5 != (int *)0x0) {
    operator_delete__(piVar5);
  }
  piVar5 = getHistFreqFromTriple
                     ((TRIPLERGB **)mrx1,h_00,w,1,"histograms/Part1/histGreen/","histGreen.csv");
  dVar2 = getEntropy(piVar5,N);
  if (piVar5 != (int *)0x0) {
    operator_delete__(piVar5);
  }
  piVar5 = getHistFreqFromTriple
                     ((TRIPLERGB **)mrx1,h_00,w,2,"histograms/Part1/histBlue/","histBlue.csv");
  local_68 = getEntropy(piVar5,N);
  if (piVar5 != (int *)0x0) {
    operator_delete__(piVar5);
  }
  piVar5 = getHistFreqFromTriple((TRIPLERGB **)mrx,h_00,w,0,"histograms/Part1/histY/","histY.csv");
  local_70 = getEntropy(piVar5,N);
  if (piVar5 != (int *)0x0) {
    operator_delete__(piVar5);
  }
  piVar5 = getHistFreqFromTriple((TRIPLERGB **)mrx,h_00,w,1,"histograms/Part1/histCb/","histCb.csv")
  ;
  local_78 = getEntropy(piVar5,N);
  if (piVar5 != (int *)0x0) {
    operator_delete__(piVar5);
  }
  piVar5 = getHistFreqFromTriple((TRIPLERGB **)mrx,h_00,w,2,"histograms/Part1/histCr/","histCr.csv")
  ;
  dVar3 = getEntropy(piVar5,N);
  if (piVar5 != (int *)0x0) {
    operator_delete__(piVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Entropy_Red = ",0xe);
  poVar4 = std::ostream::_M_insert<double>(dVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Entropy_Green = ",0x10);
  poVar4 = std::ostream::_M_insert<double>(dVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Entropy_Blue = ",0xf);
  poVar4 = std::ostream::_M_insert<double>(local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Entropy_Y = ",0xc);
  poVar4 = std::ostream::_M_insert<double>(local_70);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Entropy_Cb = ",0xd);
  poVar4 = std::ostream::_M_insert<double>(local_78);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Entropy_Cr = ",0xd);
  poVar4 = std::ostream::_M_insert<double>(dVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  puts("-------------------------------------");
  puts("-------------------------------------");
  puts("-------------------------------------");
  usleep(2000000);
  if (uVar6 == 0) {
    if (mrx1 == (TRIPLEBYTES **)0x0) goto LAB_0011026a;
  }
  else {
    uVar7 = 0;
    do {
      if (mrx1[uVar7] != (TRIPLEBYTES *)0x0) {
        operator_delete__(mrx1[uVar7]);
      }
      if (mrx[uVar7] != (TRIPLEYCbCr *)0x0) {
        operator_delete__(mrx[uVar7]);
      }
      if (mrxY[uVar7] != (TRIPLERGB *)0x0) {
        operator_delete__(mrxY[uVar7]);
      }
      if (mrxCb[uVar7] != (TRIPLERGB *)0x0) {
        operator_delete__(mrxCb[uVar7]);
      }
      if (mrxCr[uVar7] != (TRIPLERGB *)0x0) {
        operator_delete__(mrxCr[uVar7]);
      }
      if (mrx2[uVar7] != (TRIPLEBYTES *)0x0) {
        operator_delete__(mrx2[uVar7]);
      }
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  operator_delete__(mrx1);
LAB_0011026a:
  if (mrx != (TRIPLEYCbCr **)0x0) {
    operator_delete__(mrx);
  }
  if (mrxY != (TRIPLERGB **)0x0) {
    operator_delete__(mrxY);
  }
  if (mrxCb != (TRIPLERGB **)0x0) {
    operator_delete__(mrxCb);
  }
  if (mrxCr != (TRIPLERGB **)0x0) {
    operator_delete__(mrxCr);
  }
  if (mrx2 != (TRIPLEBYTES **)0x0) {
    operator_delete__(mrx2);
  }
  return;
}

Assistant:

void example1(const char *filename, const char *file_Y, const char *file_Cb, const char *file_Cr,
              const char *file_rgb_recov) {
    BITMAPFILEHEADER bmFileDef;
    BITMAPINFOHEADER bmInfoDef;
    std::cout << "reading file...\n";
    system("mkdir -p images");
    system("mkdir -p histograms");
    //Read bmp file
    TRIPLERGB **mrxRGB = loadBMPFile(&bmFileDef, &bmInfoDef, filename);
    std::cout << "-------------------------------------\n";
    printHeader(bmFileDef, bmInfoDef);
    std::cout << "-------------------------------------\n";
    size_t defHeight = bmInfoDef.biHeight;
    size_t defWidth = bmInfoDef.biWidth;
    TRIPLERGB **mrxYCbCr = (TRIPLERGB **) RGB2YCbCr(mrxRGB, defHeight, defWidth);

    save_components_to_files(mrxRGB, bmFileDef, bmInfoDef, FORMAT_RGB,
                             "file_Red.bmp", "file_Green.bmp", "file_Blue.bmp");
    save_components_to_files(mrxYCbCr, bmFileDef, bmInfoDef, FORMAT_YCBCR,
                             "file_Y.bmp", "file_Cb.bmp", "file_Cr.bmp");

    TRIPLERGB **mrxY = loadBMPFile(&bmFileDef, &bmInfoDef, file_Y);
    TRIPLERGB **mrxCb = loadBMPFile(&bmFileDef, &bmInfoDef, file_Cb);
    TRIPLERGB **mrxCr = loadBMPFile(&bmFileDef, &bmInfoDef, file_Cr);
    TRIPLERGB **mrxRGBconv = YCbCr2RGB(mrxY, mrxCb, mrxCr, defHeight, defWidth);
    saveBMPFile(bmFileDef, bmInfoDef, mrxRGBconv, file_rgb_recov);

    double PSNR_RGB_RGBr_red = getPSNR((TRIPLEBYTES **) mrxRGB, (TRIPLEBYTES **) mrxRGBconv, 0, 0, defHeight, defWidth,
                                       COMPONENT_RED);
    double PSNR_RGB_RGBr_green = getPSNR((TRIPLEBYTES **) mrxRGB, (TRIPLEBYTES **) mrxRGBconv, 0, 0, defHeight,
                                         defWidth, COMPONENT_GREEN);
    double PSNR_RGB_RGBr_blue = getPSNR((TRIPLEBYTES **) mrxRGB, (TRIPLEBYTES **) mrxRGBconv, 0, 0, defHeight, defWidth,
                                        COMPONENT_BLUE);
    checkCorrelationProperties(mrxRGB, defHeight, defWidth, FORMAT_RGB);
    checkCorrelationProperties(mrxYCbCr, defHeight, defWidth, FORMAT_YCBCR);
    std::cout << "-------------------------------------\n";
    std::cout << "PSNR(red)[RGB, RGBr] = " << PSNR_RGB_RGBr_red << "\n";
    std::cout << "PSNR(green)[RGB, RGBr] = " << PSNR_RGB_RGBr_green << "\n";
    std::cout << "PSNR(blue)[RGB, RGBr] = " << PSNR_RGB_RGBr_blue << "\n";


    std::cout << "-------------------------------------\n";
    std::cout << "\nDecimation \"mean\" x2:\n";
    decimationAndRecovering(mrxCb, bmFileDef, bmInfoDef, DECIMATION_MEAN, 2,
                            "images/decMeanCb2.bmp", "images/recMeanCb2.bmp");
    decimationAndRecovering(mrxCr, bmFileDef, bmInfoDef, DECIMATION_MEAN, 2,
                            "images/decMeanCr2.bmp", "images/recMeanCr2.bmp");
    check_PSNR_for_recov(mrxRGB, mrxY, mrxCb, mrxCr, "images/recMeanCb2.bmp", "images/recMeanCr2.bmp",
                         "images/recoveryMeanRGB2.bmp");
    std::cout << "\nDecimation \"mean\" x4:\n";
    decimationAndRecovering(mrxCb, bmFileDef, bmInfoDef, DECIMATION_MEAN, 4,
                            "images/decMeanCb4.bmp", "images/recMeanCb4.bmp");
    decimationAndRecovering(mrxCr, bmFileDef, bmInfoDef, DECIMATION_MEAN, 4,
                            "images/decMeanCr4.bmp", "images/recMeanCr4.bmp");

    check_PSNR_for_recov(mrxRGB, mrxY, mrxCb, mrxCr, "images/recMeanCb4.bmp", "images/recMeanCr4.bmp",
                         "images/recoveryMeanRGB4.bmp");

    std::cout << "\nDecimation \"ejection\" x2:\n";
    decimationAndRecovering(mrxCb, bmFileDef, bmInfoDef, DECIMATION_EJECT, 2,
                            "images/decEjectCb2.bmp", "images/recEjectCb2.bmp");
    decimationAndRecovering(mrxCr, bmFileDef, bmInfoDef, DECIMATION_EJECT, 2,
                            "images/decEjectCr2.bmp", "images/recEjectCr2.bmp");
    check_PSNR_for_recov(mrxRGB, mrxY, mrxCb, mrxCr, "images/recEjectCb2.bmp", "images/recEjectCr2.bmp",
                         "images/recoveryEjectRGB2.bmp");
    std::cout << "\nDecimation \"ejection\" x4:\n";
    decimationAndRecovering(mrxCb, bmFileDef, bmInfoDef, DECIMATION_EJECT, 4,
                            "images/decEjectCb4.bmp", "images/recEjectCb4.bmp");
    decimationAndRecovering(mrxCr, bmFileDef, bmInfoDef, DECIMATION_EJECT, 4,
                            "images/decEjectCr4.bmp", "images/recEjectCr4.bmp");

    check_PSNR_for_recov(mrxRGB, mrxY, mrxCb, mrxCr, "images/recEjectCb4.bmp", "images/recEjectCr4.bmp",
                         "images/recoveryEjectRGB4.bmp");
    std::cout << "-------------------------------------\n";

    int *freq;
    freq = getHistFreqFromTriple(mrxRGB, defHeight, defWidth, COMPONENT_RED, "histograms/Part1/histRed/",
                                 "histRed.csv");
    double entropyRed = getEntropy(freq, defHeight * defWidth);
    delete[] freq;
    freq = getHistFreqFromTriple(mrxRGB, defHeight, defWidth, COMPONENT_GREEN, "histograms/Part1/histGreen/",
                                 "histGreen.csv");
    double entropyGreen = getEntropy(freq, defHeight * defWidth);
    delete[] freq;
    freq = getHistFreqFromTriple(mrxRGB, defHeight, defWidth, COMPONENT_BLUE, "histograms/Part1/histBlue/",
                                 "histBlue.csv");
    double entropyBlue = getEntropy(freq, defHeight * defWidth);
    delete[] freq;
    freq = getHistFreqFromTriple(mrxYCbCr, defHeight, defWidth, COMPONENT_RED, "histograms/Part1/histY/", "histY.csv");
    double entropyY = getEntropy(freq, defHeight * defWidth);
    delete[] freq;
    freq = getHistFreqFromTriple(mrxYCbCr, defHeight, defWidth, COMPONENT_GREEN, "histograms/Part1/histCb/",
                                 "histCb.csv");
    double entropyCb = getEntropy(freq, defHeight * defWidth);
    delete[] freq;
    freq = getHistFreqFromTriple(mrxYCbCr, defHeight, defWidth, COMPONENT_BLUE, "histograms/Part1/histCr/",
                                 "histCr.csv");
    double entropyCr = getEntropy(freq, defHeight * defWidth);
    delete[] freq;
    std::cout << "Entropy_Red = " << entropyRed << "\n";
    std::cout << "Entropy_Green = " << entropyGreen << "\n";
    std::cout << "Entropy_Blue = " << entropyBlue << "\n";
    std::cout << "Entropy_Y = " << entropyY << "\n";
    std::cout << "Entropy_Cb = " << entropyCb << "\n";
    std::cout << "Entropy_Cr = " << entropyCr << "\n";
    printf("-------------------------------------\n");
    printf("-------------------------------------\n");
    printf("-------------------------------------\n");
    usleep(2 * 1000 * 1000);
    //system("csv_charts -h histograms/Part1/histRed/ & exit");
    //system("csv_charts -h histograms/Part1/histGreen/ & exit");
    //system("csv_charts -h histograms/Part1/histBlue/ & exit");
    //system("csv_charts -h histograms/Part1/histY/ & exit");
    //system("csv_charts -h histograms/Part1/histCb/ & exit");
    //system("csv_charts -h histograms/Part1/histCr/ & exit");
    for (int i = 0; i < defHeight; i++) {
        delete[] mrxRGB[i];
        delete[] mrxYCbCr[i];
        delete[] mrxY[i];
        delete[] mrxCb[i];
        delete[] mrxCr[i];
        delete[] mrxRGBconv[i];
    }
    delete[] mrxRGB;
    delete[] mrxYCbCr;
    delete[] mrxY;
    delete[] mrxCb;
    delete[] mrxCr;
    delete[] mrxRGBconv;
}